

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

If_Obj_t * If_ManSetupObj(If_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  If_Obj_t *pIVar4;
  void **ppvVar5;
  int iVar6;
  
  pIVar4 = (If_Obj_t *)Mem_FixedEntryFetch(p->pMemObj);
  *(undefined8 *)pIVar4 = 0;
  pIVar4->IdPio = 0;
  pIVar4->nRefs = 0;
  pIVar4->nVisits = 0;
  pIVar4->nVisitsCopy = 0;
  pIVar4->pFanin0 = (If_Obj_t *)0x0;
  pIVar4->pFanin1 = (If_Obj_t *)0x0;
  pIVar4->pEquiv = (If_Obj_t *)0x0;
  pIVar4->EstRefs = 0.0;
  pIVar4->Required = 0.0;
  *(undefined8 *)&pIVar4->LValue = 0;
  (pIVar4->field_22).pCopy = (void *)0x0;
  pIVar4->pCutSet = (If_Set_t *)0x0;
  (pIVar4->CutBest).Area = 0.0;
  (pIVar4->CutBest).Edge = 0.0;
  (pIVar4->CutBest).Power = 0.0;
  (pIVar4->CutBest).Delay = 0.0;
  (pIVar4->CutBest).iCutFunc = 0;
  (pIVar4->CutBest).uMaskFunc = 0;
  *(undefined8 *)&(pIVar4->CutBest).uSign = 0;
  memset(&pIVar4->CutBest,0,(long)p->nCutBytes);
  (pIVar4->CutBest).field_0x1e = (char)p->pPars->nLutSize;
  pVVar3 = p->vObjs;
  uVar1 = pVVar3->nSize;
  pIVar4->Id = uVar1;
  uVar2 = pVVar3->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_00402001;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
      }
      pVVar3->pArray = ppvVar5;
    }
    pVVar3->nCap = iVar6;
  }
LAB_00402001:
  iVar6 = pVVar3->nSize;
  pVVar3->nSize = iVar6 + 1;
  pVVar3->pArray[iVar6] = pIVar4;
  pIVar4->Required = 1e+20;
  return pIVar4;
}

Assistant:

If_Obj_t * If_ManSetupObj( If_Man_t * p )
{
    If_Obj_t * pObj;
    // get memory for the object
    pObj = (If_Obj_t *)Mem_FixedEntryFetch( p->pMemObj );
    memset( pObj, 0, sizeof(If_Obj_t) );
    If_CutSetup( p, &pObj->CutBest );
    // assign ID and save 
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // set the required times
    pObj->Required = IF_FLOAT_LARGE;
    return pObj;
}